

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThreadPool.cpp
# Opt level: O0

void __thiscall
sznet::net::EventLoopThreadPool::start(EventLoopThreadPool *this,ThreadInitCallback *cb)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  size_type __maxlen;
  undefined8 uVar4;
  EventLoopThread *this_00;
  EventLoop *local_88;
  unique_ptr<sznet::net::EventLoopThread,_std::default_delete<sznet::net::EventLoopThread>_>
  local_80;
  undefined1 local_72;
  allocator local_71;
  string local_70 [32];
  EventLoopThread *local_50;
  EventLoopThread *t;
  int i;
  allocator_type local_31;
  undefined1 local_30 [8];
  vector<char,_std::allocator<char>_> vbuf;
  ThreadInitCallback *cb_local;
  EventLoopThreadPool *this_local;
  
  vbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = cb;
  if (((this->m_started ^ 0xffU) & 1) != 0) {
    EventLoop::assertInLoopThread(this->m_baseLoop);
    this->m_started = true;
    lVar2 = std::__cxx11::string::size();
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_30,lVar2 + 0x20,&local_31);
    std::allocator<char>::~allocator(&local_31);
    for (t._0_4_ = 0; (int)(uint)t < this->m_numThreads; t._0_4_ = (uint)t + 1) {
      pcVar3 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)local_30);
      __maxlen = std::vector<char,_std::allocator<char>_>::size
                           ((vector<char,_std::allocator<char>_> *)local_30);
      uVar4 = std::__cxx11::string::c_str();
      snprintf(pcVar3,__maxlen,"%s%d",uVar4,(ulong)(uint)t);
      this_00 = (EventLoopThread *)operator_new(0x168);
      uVar4 = vbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_;
      local_72 = 1;
      pcVar3 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)local_30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,pcVar3,&local_71);
      EventLoopThread::EventLoopThread(this_00,(ThreadInitCallback *)uVar4,(string *)local_70);
      local_72 = 0;
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
      local_50 = this_00;
      std::unique_ptr<sznet::net::EventLoopThread,std::default_delete<sznet::net::EventLoopThread>>
      ::unique_ptr<std::default_delete<sznet::net::EventLoopThread>,void>
                ((unique_ptr<sznet::net::EventLoopThread,std::default_delete<sznet::net::EventLoopThread>>
                  *)&local_80,this_00);
      std::
      vector<std::unique_ptr<sznet::net::EventLoopThread,_std::default_delete<sznet::net::EventLoopThread>_>,_std::allocator<std::unique_ptr<sznet::net::EventLoopThread,_std::default_delete<sznet::net::EventLoopThread>_>_>_>
      ::push_back(&this->m_threads,(value_type *)&local_80);
      std::
      unique_ptr<sznet::net::EventLoopThread,_std::default_delete<sznet::net::EventLoopThread>_>::
      ~unique_ptr(&local_80);
      local_88 = EventLoopThread::startLoop(local_50);
      std::vector<sznet::net::EventLoop_*,_std::allocator<sznet::net::EventLoop_*>_>::push_back
                (&this->m_loops,&local_88);
    }
    if ((this->m_numThreads == 0) &&
       (bVar1 = std::function::operator_cast_to_bool
                          ((function *)
                           vbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_),
       bVar1)) {
      std::function<void_(sznet::net::EventLoop_*)>::operator()
                ((function<void_(sznet::net::EventLoop_*)> *)
                 vbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_,
                 this->m_baseLoop);
    }
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_30);
    return;
  }
  __assert_fail("!m_started",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/EventLoopThreadPool.cpp"
                ,0x1d,"void sznet::net::EventLoopThreadPool::start(const ThreadInitCallback &)");
}

Assistant:

void EventLoopThreadPool::start(const ThreadInitCallback& cb)
{
	assert(!m_started);
	m_baseLoop->assertInLoopThread();
	m_started = true;

	std::vector<char> vbuf(m_name.size() + 32);
	for (int i = 0; i < m_numThreads; ++i)
	{
		snprintf(vbuf.data(), vbuf.size(), "%s%d", m_name.c_str(), i);
		EventLoopThread* t = new EventLoopThread(cb, vbuf.data());
		m_threads.push_back(std::unique_ptr<EventLoopThread>(t));
		// 阻塞
		// 启动EventLoopThread线程，在进入事件循环之前，会调用cb
		m_loops.push_back(t->startLoop());
	}
	// 只有一个EventLoop，在这个EventLoop进入事件循环之前，调用cb
	if (m_numThreads == 0 && cb)
	{
		cb(m_baseLoop);
	}
}